

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execBitImEa<(moira::Instr)32,(moira::Mode)3,(moira::Size)1>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  undefined2 in_SI;
  Moira *in_RDI;
  u32 data;
  u32 ea;
  int dst;
  u8 src;
  u32 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  u32 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined2 in_stack_fffffffffffffff4;
  undefined4 uVar3;
  uint n;
  Moira *this_00;
  
  uVar3 = CONCAT22(in_SI,in_stack_fffffffffffffff4);
  this_00 = in_RDI;
  uVar2 = readI<(moira::Size)1>(in_RDI);
  n = CONCAT22((short)((uint)uVar3 >> 0x10),CONCAT11((char)uVar2,(char)uVar3)) & 0xffff07ff;
  bVar1 = readOp<(moira::Mode)3,(moira::Size)1,0ul>
                    (this_00,n,(u32 *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                     (u32 *)in_RDI);
  if (bVar1) {
    bit<(moira::Instr)32>(in_RDI,in_stack_ffffffffffffffe8,(u8)(n >> 8));
    prefetch<0ul>(in_RDI);
    writeM<(moira::Mode)3,(moira::Size)1,4ul>
              (in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void
Moira::execBitImEa(u16 opcode)
{
    u8  src = readI<S>();
    int dst = _____________xxx(opcode);

    switch (M)
    {
        case 0:
        {
            src &= 0b11111;
            u32 data = readD(dst);
            data = bit<I>(data, src);

            prefetch<POLLIPL>();

            sync(cyclesBit<I>(src));
            if (I != BTST) writeD(dst, data);
            break;
        }
        default:
        {
            src &= 0b111;
            u32 ea, data;
            if (!readOp<M,S>(dst, ea, data)) return;

            data = bit<I>(data, src);

            if (I != BTST) {
                prefetch();
                writeM <M, S, POLLIPL> (ea, data);
            } else {
                prefetch<POLLIPL>();
            }
        }
    }
}